

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O3

CopyPtr<slang::AssociativeArray> * __thiscall
slang::CopyPtr<slang::AssociativeArray>::operator=
          (CopyPtr<slang::AssociativeArray> *this,CopyPtr<slang::AssociativeArray> *other)

{
  AssociativeArray *pAVar1;
  AssociativeArray *this_00;
  
  if (this != other) {
    pAVar1 = this->ptr;
    if (pAVar1 != (AssociativeArray *)0x0) {
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&pAVar1->defaultValue);
      std::
      _Rb_tree<slang::ConstantValue,_std::pair<const_slang::ConstantValue,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
      ::~_Rb_tree((_Rb_tree<slang::ConstantValue,_std::pair<const_slang::ConstantValue,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                   *)pAVar1);
    }
    operator_delete(pAVar1,0x58);
    this_00 = (AssociativeArray *)operator_new(0x58);
    pAVar1 = other->ptr;
    std::
    _Rb_tree<slang::ConstantValue,_std::pair<const_slang::ConstantValue,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
    ::_Rb_tree((_Rb_tree<slang::ConstantValue,_std::pair<const_slang::ConstantValue,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                *)this_00,
               (_Rb_tree<slang::ConstantValue,_std::pair<const_slang::ConstantValue,_slang::ConstantValue>,_std::_Select1st<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
                *)pAVar1);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&this_00->defaultValue,
                      (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&pAVar1->defaultValue);
    this->ptr = this_00;
  }
  return this;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }